

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirSAVEHOB(void)

{
  uint start;
  bool bVar1;
  int iVar2;
  uint length;
  EStatus type;
  char *message;
  aint val;
  string fnaamh;
  path fnaam;
  uint local_94;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  path local_50;
  
  if ((DeviceID == (char *)0x0) || (pass != 3)) {
    if (DeviceID == (char *)0x0) {
      Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_50,&lp);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  bVar1 = anyComma(&lp);
  type = PASS3;
  message = "[SAVEHOB] Syntax error. No parameters";
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      GetDelimitedString_abi_cxx11_(&local_70,&lp);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_88 == 0) {
LAB_0010e7ee:
        message = "[SAVEHOB] Syntax error";
      }
      else {
        bVar1 = anyComma(&lp);
        if (bVar1) {
          bVar1 = anyComma(&lp);
          if (!bVar1) {
            iVar2 = ParseExpression(&lp,(aint *)&local_94);
            start = local_94;
            if (iVar2 == 0) goto LAB_0010e7ee;
            if ((int)local_94 < 0x4000) {
              message = "[SAVEHOB] Values less than 4000h are not allowed";
            }
            else if (local_94 < 0x10000) {
              bVar1 = anyComma(&lp);
              length = 0xffffffff;
              if (bVar1) {
                iVar2 = ParseExpression(&lp,(aint *)&local_94);
                if (iVar2 == 0) goto LAB_0010e7ee;
                length = local_94;
                if ((int)local_94 < 0) {
                  message = "[SAVEHOB] Negative values are not allowed";
                  goto LAB_0010e7f1;
                }
              }
              iVar2 = SaveHobeta(&local_50,(char *)local_90,start,length);
              if (iVar2 != 0) goto LAB_0010e805;
              type = IF_FIRST;
              message = "[SAVEHOB] Error writing file (Disk full?)";
            }
            else {
              message = "[SAVEHOB] Values more than FFFFh are not allowed";
            }
          }
        }
      }
    }
  }
LAB_0010e7f1:
  Error(message,bp,type);
LAB_0010e805:
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  return;
}

Assistant:

static void dirSAVEHOB() {
	if (!DeviceID || pass != LASTPASS) {
		if (!DeviceID) Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	aint val;
	int start = -1,length = -1;
	bool exec = true;

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			fnaamh = GetDelimitedString(lp);
			if (fnaamh.empty()) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return; //is this ok?
	}

	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0x4000) {
				Error("[SAVEHOB] Values less than 4000h are not allowed", bp, PASS3); return;
			} else if (val > 0xFFFF) {
			  	Error("[SAVEHOB] Values more than FFFFh are not allowed", bp, PASS3); return;
			}
			start = val;
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
		if (anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0) {
				Error("[SAVEHOB] Negative values are not allowed", bp, PASS3); return;
			}
			length = val;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
	}
	if (exec && !SaveHobeta(fnaam, fnaamh.c_str(), start, length)) {
		Error("[SAVEHOB] Error writing file (Disk full?)", bp, IF_FIRST); return;
	}
}